

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

uint GetAutoSenseRadix(StringRef *Str)

{
  StringRef *pSVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  StringRef SVar5;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  StringRef local_88;
  char *local_78;
  size_t local_70;
  StringRef local_68;
  StringRef local_58;
  char *local_48;
  size_t local_40;
  StringRef local_38;
  StringRef local_28;
  StringRef *local_18;
  StringRef *Str_local;
  
  local_18 = Str;
  bVar2 = llvm::StringRef::empty(Str);
  pSVar1 = local_18;
  if (bVar2) {
    return 10;
  }
  llvm::StringRef::StringRef(&local_28,"0x");
  bVar2 = llvm::StringRef::startswith(pSVar1,local_28);
  pSVar1 = local_18;
  if (!bVar2) {
    llvm::StringRef::StringRef(&local_38,"0X");
    bVar2 = llvm::StringRef::startswith(pSVar1,local_38);
    pSVar1 = local_18;
    if (!bVar2) {
      llvm::StringRef::StringRef(&local_58,"0b");
      bVar2 = llvm::StringRef::startswith(pSVar1,local_58);
      pSVar1 = local_18;
      if (!bVar2) {
        llvm::StringRef::StringRef(&local_68,"0B");
        bVar2 = llvm::StringRef::startswith(pSVar1,local_68);
        pSVar1 = local_18;
        if (!bVar2) {
          llvm::StringRef::StringRef(&local_88,"0o");
          bVar2 = llvm::StringRef::startswith(pSVar1,local_88);
          if (bVar2) {
            SVar5 = llvm::StringRef::substr(local_18,2,0xffffffffffffffff);
            local_98 = SVar5.Data;
            local_18->Data = local_98;
            local_90 = SVar5.Length;
            local_18->Length = local_90;
            return 8;
          }
          cVar3 = llvm::StringRef::operator[](local_18,0);
          if ((cVar3 == '0') && (sVar4 = llvm::StringRef::size(local_18), 1 < sVar4)) {
            cVar3 = llvm::StringRef::operator[](local_18,1);
            bVar2 = llvm::isDigit(cVar3);
            if (bVar2) {
              SVar5 = llvm::StringRef::substr(local_18,1,0xffffffffffffffff);
              local_a8 = SVar5.Data;
              local_18->Data = local_a8;
              local_a0 = SVar5.Length;
              local_18->Length = local_a0;
              return 8;
            }
          }
          return 10;
        }
      }
      SVar5 = llvm::StringRef::substr(local_18,2,0xffffffffffffffff);
      local_78 = SVar5.Data;
      local_18->Data = local_78;
      local_70 = SVar5.Length;
      local_18->Length = local_70;
      return 2;
    }
  }
  SVar5 = llvm::StringRef::substr(local_18,2,0xffffffffffffffff);
  local_48 = SVar5.Data;
  local_18->Data = local_48;
  local_40 = SVar5.Length;
  local_18->Length = local_40;
  return 0x10;
}

Assistant:

static unsigned GetAutoSenseRadix(StringRef &Str) {
  if (Str.empty())
    return 10;

  if (Str.startswith("0x") || Str.startswith("0X")) {
    Str = Str.substr(2);
    return 16;
  }

  if (Str.startswith("0b") || Str.startswith("0B")) {
    Str = Str.substr(2);
    return 2;
  }

  if (Str.startswith("0o")) {
    Str = Str.substr(2);
    return 8;
  }

  if (Str[0] == '0' && Str.size() > 1 && isDigit(Str[1])) {
    Str = Str.substr(1);
    return 8;
  }

  return 10;
}